

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es2fIntegerStateQueryTests.cpp
# Opt level: O3

void __thiscall
deqp::gles2::Functional::anon_unknown_2::SamplesTestCase::test(SamplesTestCase *this)

{
  ostringstream *poVar1;
  StateVerifier *pSVar2;
  TestContext *pTVar3;
  RenderTarget *pRVar4;
  GLint validSamples [2];
  undefined8 local_1a0;
  undefined1 local_198 [120];
  ios_base local_120 [264];
  
  pRVar4 = Context::getRenderTarget((this->super_ApiCase).super_TestCase.m_context);
  if (pRVar4->m_numSamples < 2) {
    local_1a0 = 0x100000000;
    local_198._0_8_ = (this->super_ApiCase).m_log;
    poVar1 = (ostringstream *)(local_198 + 8);
    std::__cxx11::ostringstream::ostringstream(poVar1);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)poVar1,"Expecting GL_SAMPLES to be 0 or 1",0x21);
    tcu::MessageBuilder::operator<<
              ((MessageBuilder *)local_198,(EndMessageToken *)&tcu::TestLog::EndMessage);
    std::__cxx11::ostringstream::~ostringstream(poVar1);
    std::ios_base::~ios_base(local_120);
    (*this->m_verifier->_vptr_StateVerifier[8])
              (this->m_verifier,
               (this->super_ApiCase).super_TestCase.super_TestCase.super_TestNode.m_testCtx,0x80a9,
               &local_1a0,2);
  }
  else {
    local_198._0_8_ = (this->super_ApiCase).m_log;
    poVar1 = (ostringstream *)(local_198 + 8);
    std::__cxx11::ostringstream::ostringstream(poVar1);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar1,"Sample count is ",0x10);
    pRVar4 = Context::getRenderTarget((this->super_ApiCase).super_TestCase.m_context);
    std::ostream::operator<<(poVar1,pRVar4->m_numSamples);
    tcu::MessageBuilder::operator<<
              ((MessageBuilder *)local_198,(EndMessageToken *)&tcu::TestLog::EndMessage);
    std::__cxx11::ostringstream::~ostringstream(poVar1);
    std::ios_base::~ios_base(local_120);
    pSVar2 = this->m_verifier;
    pTVar3 = (this->super_ApiCase).super_TestCase.super_TestCase.super_TestNode.m_testCtx;
    pRVar4 = Context::getRenderTarget((this->super_ApiCase).super_TestCase.m_context);
    (*pSVar2->_vptr_StateVerifier[2])(pSVar2,pTVar3,0x80a9,(ulong)(uint)pRVar4->m_numSamples);
  }
  ApiCase::expectError(&this->super_ApiCase,0);
  return;
}

Assistant:

void test (void)
	{
		// MSAA?
		if (m_context.getRenderTarget().getNumSamples() > 1)
		{
			m_log << tcu::TestLog::Message << "Sample count is " << (m_context.getRenderTarget().getNumSamples()) << tcu::TestLog::EndMessage;

			m_verifier->verifyInteger(m_testCtx, GL_SAMPLES, m_context.getRenderTarget().getNumSamples());
			expectError(GL_NO_ERROR);
		}
		else
		{
			const glw::GLint validSamples[] = {0, 1};

			m_log << tcu::TestLog::Message << "Expecting GL_SAMPLES to be 0 or 1" << tcu::TestLog::EndMessage;

			m_verifier->verifyIntegerAnyOf(m_testCtx, GL_SAMPLES, validSamples, DE_LENGTH_OF_ARRAY(validSamples));
			expectError(GL_NO_ERROR);
		}
	}